

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 ImGui::NavCalcPreferredRefPos(void)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImGuiWindow *window;
  ImGuiViewportP *pIVar3;
  ImGuiContext *pIVar4;
  ImVec2 *pIVar5;
  uint uVar6;
  ImVec2 IVar7;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar15;
  float fVar17;
  undefined1 auVar16 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  
  pIVar4 = GImGui;
  if ((GImGui->NavDisableHighlight == false) &&
     (window = GImGui->NavWindow, (GImGui->NavDisableMouseHover & window != (ImGuiWindow *)0x0) != 0
     )) {
    IVar7 = (window->DC).CursorStartPos;
    IVar1 = window->NavRectRel[GImGui->NavLayer].Min;
    IVar2 = window->NavRectRel[GImGui->NavLayer].Max;
    fVar15 = IVar7.x;
    fVar18 = IVar1.x + fVar15;
    fVar17 = IVar7.y;
    fVar19 = IVar1.y + fVar17;
    fVar20 = 0.0;
    fVar21 = 0.0;
    fVar15 = IVar2.x + fVar15;
    fVar17 = IVar2.y + fVar17;
    fVar13 = 0.0;
    fVar14 = 0.0;
    if ((window->LastFrameActive != GImGui->FrameCount) &&
       ((((fVar9 = (window->ScrollTarget).x, fVar9 != 3.4028235e+38 || (NAN(fVar9))) ||
         (fVar9 = (window->ScrollTarget).y, fVar9 != 3.4028235e+38)) || (NAN(fVar9))))) {
      IVar7 = CalcNextScrollFromScrollTargetAndClamp(window);
      fVar9 = (window->Scroll).x - IVar7.x;
      fVar12 = (window->Scroll).y - IVar7.y;
      fVar13 = 0.0 - (float)extraout_XMM0_Qb;
      fVar14 = 0.0 - (float)((ulong)extraout_XMM0_Qb >> 0x20);
      fVar18 = fVar18 + fVar9;
      fVar19 = fVar19 + fVar12;
      fVar20 = fVar13 + 0.0;
      fVar21 = fVar14 + 0.0;
      fVar15 = fVar15 + fVar9;
      fVar17 = fVar17 + fVar12;
      fVar13 = fVar13 + 0.0;
      fVar14 = fVar14 + 0.0;
    }
    auVar8._0_4_ = (pIVar4->Style).FramePadding.x * 4.0;
    pIVar3 = *(GImGui->Viewports).Data;
    auVar10._0_4_ = fVar15 - fVar18;
    auVar10._4_4_ = fVar17 - fVar19;
    auVar10._8_4_ = fVar13 - fVar20;
    auVar10._12_4_ = fVar14 - fVar21;
    auVar8._4_4_ = (pIVar4->Style).FramePadding.y;
    auVar8._8_8_ = 0;
    auVar8 = minps(auVar8,auVar10);
    fVar18 = fVar18 + auVar8._0_4_;
    auVar16._4_4_ = fVar17 - auVar8._4_4_;
    auVar16._0_4_ = fVar18;
    auVar16._8_4_ = fVar20 + auVar8._8_4_;
    auVar16._12_4_ = fVar21 + auVar8._12_4_;
    IVar7 = (pIVar3->super_ImGuiViewport).Pos;
    IVar1 = (pIVar3->super_ImGuiViewport).Size;
    fVar15 = IVar7.x;
    auVar11._0_4_ = IVar1.x + fVar15;
    fVar17 = IVar7.y;
    auVar11._4_4_ = IVar1.y + fVar17;
    auVar11._8_8_ = 0;
    auVar8 = minps(auVar11,auVar16);
    uVar6 = -(uint)(fVar18 < fVar15);
    IVar7.x = (float)(int)(float)(~uVar6 & auVar8._0_4_ | (uint)fVar15 & uVar6);
    IVar7.y = (float)(int)(float)(~-(uint)(auVar16._4_4_ < fVar17) & auVar8._4_4_ |
                                 (uint)fVar17 & -(uint)(auVar16._4_4_ < fVar17));
  }
  else {
    pIVar5 = &GImGui->MouseLastValidPos;
    if (-256000.0 <= (GImGui->IO).MousePos.y && -256000.0 <= (GImGui->IO).MousePos.x) {
      pIVar5 = &(GImGui->IO).MousePos;
    }
    IVar7.x = pIVar5->x + 1.0;
    IVar7.y = pIVar5->y;
  }
  return IVar7;
}

Assistant:

static ImVec2 ImGui::NavCalcPreferredRefPos()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.NavWindow;
    if (g.NavDisableHighlight || !g.NavDisableMouseHover || !window)
    {
        // Mouse (we need a fallback in case the mouse becomes invalid after being used)
        // The +1.0f offset when stored by OpenPopupEx() allows reopening this or another popup (same or another mouse button) while not moving the mouse, it is pretty standard.
        // In theory we could move that +1.0f offset in OpenPopupEx()
        ImVec2 p = IsMousePosValid(&g.IO.MousePos) ? g.IO.MousePos : g.MouseLastValidPos;
        return ImVec2(p.x + 1.0f, p.y);
    }
    else
    {
        // When navigation is active and mouse is disabled, pick a position around the bottom left of the currently navigated item
        // Take account of upcoming scrolling (maybe set mouse pos should be done in EndFrame?)
        ImRect rect_rel = WindowRectRelToAbs(window, window->NavRectRel[g.NavLayer]);
        if (window->LastFrameActive != g.FrameCount && (window->ScrollTarget.x != FLT_MAX || window->ScrollTarget.y != FLT_MAX))
        {
            ImVec2 next_scroll = CalcNextScrollFromScrollTargetAndClamp(window);
            rect_rel.Translate(window->Scroll - next_scroll);
        }
        ImVec2 pos = ImVec2(rect_rel.Min.x + ImMin(g.Style.FramePadding.x * 4, rect_rel.GetWidth()), rect_rel.Max.y - ImMin(g.Style.FramePadding.y, rect_rel.GetHeight()));
        ImGuiViewport* viewport = GetMainViewport();
        return ImFloor(ImClamp(pos, viewport->Pos, viewport->Pos + viewport->Size)); // ImFloor() is important because non-integer mouse position application in backend might be lossy and result in undesirable non-zero delta.
    }
}